

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O2

void __thiscall TypedImageChannel<float>::resize(TypedImageChannel<float> *this)

{
  Image *pIVar1;
  
  pIVar1 = (this->super_ImageChannel)._image;
  Imf_3_4::Array2D<float>::resizeEraseUnsafe
            (&this->_pixels,
             (long)((((pIVar1->_dataWindow).max.y - (pIVar1->_dataWindow).min.y) + 1) /
                   this->_ySampling),
             (long)((((pIVar1->_dataWindow).max.x - (pIVar1->_dataWindow).min.x) + 1) /
                   this->_xSampling));
  return;
}

Assistant:

Image&       image () { return _image; }